

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

int Gia_ManMiter_rec(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  uint uVar1;
  int iLit0;
  int iLit1;
  
  uVar1 = pObj->Value;
  if (uVar1 == 0xffffffff) {
    if (((int)(uint)*(undefined8 *)pObj < 0) ||
       (uVar1 = (uint)*(undefined8 *)pObj & 0x1fffffff, uVar1 == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDup.c"
                    ,0xa7e,"int Gia_ManMiter_rec(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
    }
    Gia_ManMiter_rec(pNew,p,pObj + -(ulong)uVar1);
    Gia_ManMiter_rec(pNew,p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff));
    iLit0 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    uVar1 = Gia_ManHashAnd(pNew,iLit0,iLit1);
    pObj->Value = uVar1;
  }
  return uVar1;
}

Assistant:

int Gia_ManMiter_rec( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( ~pObj->Value )
        return pObj->Value;
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManMiter_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManMiter_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}